

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentalProcessPdu.cpp
# Opt level: O0

void __thiscall
DIS::EnvironmentalProcessPdu::marshal(EnvironmentalProcessPdu *this,DataStream *dataStream)

{
  undefined8 uVar1;
  size_type sVar2;
  const_reference pvVar3;
  undefined1 local_38 [8];
  Environment x;
  size_t idx;
  DataStream *dataStream_local;
  EnvironmentalProcessPdu *this_local;
  
  SyntheticEnvironmentFamilyPdu::marshal(&this->super_SyntheticEnvironmentFamilyPdu,dataStream);
  EntityID::marshal(&this->_environementalProcessID,dataStream);
  EntityType::marshal(&this->_environmentType,dataStream);
  DataStream::operator<<(dataStream,this->_modelType);
  DataStream::operator<<(dataStream,this->_environmentStatus);
  sVar2 = std::vector<DIS::Environment,_std::allocator<DIS::Environment>_>::size
                    (&this->_environmentRecords);
  DataStream::operator<<(dataStream,(uchar)sVar2);
  DataStream::operator<<(dataStream,this->_sequenceNumber);
  x._padding2 = '\0';
  x._17_7_ = 0;
  while( true ) {
    uVar1 = x._16_8_;
    sVar2 = std::vector<DIS::Environment,_std::allocator<DIS::Environment>_>::size
                      (&this->_environmentRecords);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar3 = std::vector<DIS::Environment,_std::allocator<DIS::Environment>_>::operator[]
                       (&this->_environmentRecords,x._16_8_);
    Environment::Environment((Environment *)local_38,pvVar3);
    Environment::marshal((Environment *)local_38,dataStream);
    Environment::~Environment((Environment *)local_38);
    x._16_8_ = x._16_8_ + 1;
  }
  return;
}

Assistant:

void EnvironmentalProcessPdu::marshal(DataStream& dataStream) const
{
    SyntheticEnvironmentFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _environementalProcessID.marshal(dataStream);
    _environmentType.marshal(dataStream);
    dataStream << _modelType;
    dataStream << _environmentStatus;
    dataStream << ( unsigned char )_environmentRecords.size();
    dataStream << _sequenceNumber;

     for(size_t idx = 0; idx < _environmentRecords.size(); idx++)
     {
        Environment x = _environmentRecords[idx];
        x.marshal(dataStream);
     }

}